

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O0

int Edg_ObjImprove(Gia_Man_t *p,int iObj,int nEdgeLimit,int DelayMax,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  int Delay2;
  int Delay1;
  int iNext;
  int i;
  int Count;
  int nEdges;
  int nEdgeDiff;
  int pFanouts [4];
  int pFanins [4];
  uint local_40;
  uint local_3c;
  int nFanoutsENC;
  int nFaninsENC;
  int nFanoutsEC;
  int nFaninsEC;
  int nFanoutsC;
  int nFaninsC;
  int fVerbose_local;
  int DelayMax_local;
  int nEdgeLimit_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  nFaninsEC = 0;
  nFanoutsEC = 0;
  nFaninsENC = 0;
  nFanoutsENC = 0;
  local_3c = 0;
  local_40 = 0;
  i = 0;
  iNext = 0;
  iVar1 = Vec_IntEntry(p->vEdgeDelayR,iObj);
  for (Delay1 = 0; iVar2 = Gia_ObjLutSize2(p,iObj), Delay1 < iVar2; Delay1 = Delay1 + 1) {
    iVar2 = Gia_ObjLutFanin2(p,iObj,Delay1);
    pGVar6 = Gia_ManObj(p,iVar2);
    iVar3 = Gia_ObjIsAnd(pGVar6);
    if (iVar3 != 0) {
      iVar3 = Vec_IntEntry(p->vEdgeDelay,iVar2);
      iVar4 = Gia_ObjHaveEdge(p,iObj,iVar2);
      if (iVar4 == 0) {
        if (DelayMax < iVar1 + iVar3 + 1) {
          __assert_fail("Delay1 + Delay2 + 1 <= DelayMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                        ,0x32c,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
        }
        if (iVar1 + iVar3 + 1 == DelayMax) {
          pFanouts[(long)nFaninsEC + 2] = iVar2;
          nFaninsEC = nFaninsEC + 1;
        }
      }
      else {
        i = i + 1;
        if (DelayMax < iVar1 + iVar3) {
          __assert_fail("Delay1 + Delay2 <= DelayMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                        ,0x324,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
        }
        if (iVar1 + iVar3 == DelayMax) {
          nFaninsENC = nFaninsENC + 1;
        }
        else {
          local_3c = local_3c + 1;
        }
      }
    }
  }
  iVar1 = Vec_IntEntry(p->vEdgeDelay,iObj);
  for (Delay1 = 0; iVar2 = Gia_ObjLutFanoutNum2(p,iObj), Delay1 < iVar2; Delay1 = Delay1 + 1) {
    iVar2 = Gia_ObjLutFanout2(p,iObj,Delay1);
    pGVar6 = Gia_ManObj(p,iVar2);
    iVar3 = Gia_ObjIsAnd(pGVar6);
    if (iVar3 == 0) {
      __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p, iNext))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                    ,0x338,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
    }
    iVar3 = Vec_IntEntry(p->vEdgeDelayR,iVar2);
    iVar4 = Gia_ObjHaveEdge(p,iObj,iVar2);
    if (iVar4 == 0) {
      if (DelayMax < iVar1 + iVar3 + 1) {
        __assert_fail("Delay1 + Delay2 + 1 <= DelayMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                      ,0x345,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
      }
      if (iVar1 + iVar3 + 1 == DelayMax) {
        if (nFanoutsEC < nEdgeLimit) {
          (&nEdges)[nFanoutsEC] = iVar2;
        }
        nFanoutsEC = nFanoutsEC + 1;
      }
    }
    else {
      i = i + 1;
      if (DelayMax < iVar1 + iVar3) {
        __assert_fail("Delay1 + Delay2 <= DelayMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                      ,0x33d,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
      }
      if (iVar1 + iVar3 == DelayMax) {
        nFanoutsENC = nFanoutsENC + 1;
      }
      else {
        local_40 = local_40 + 1;
      }
    }
  }
  if (fVerbose != 0) {
    printf("%8d : ",(ulong)(uint)iObj);
    printf("Edges = %d  ",(ulong)(uint)i);
    uVar5 = Gia_ObjLutSize2(p,iObj);
    printf("Fanins (all %d  EC %d  ENC %d  C %d)  ",(ulong)uVar5,(ulong)(uint)nFaninsENC,
           (ulong)local_3c,(ulong)(uint)nFaninsEC);
    uVar5 = Gia_ObjLutFanoutNum2(p,iObj);
    printf("Fanouts (all %d  EC %d  ENC %d  C %d)  ",(ulong)uVar5,(ulong)(uint)nFanoutsENC,
           (ulong)local_40,(ulong)(uint)nFanoutsEC);
  }
  if (nEdgeLimit < i) {
    __assert_fail("nEdges <= nEdgeLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                  ,0x358,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
  }
  if (i == nEdgeLimit) {
    if (fVerbose != 0) {
      printf("Full\n");
    }
  }
  else {
    if (((nFaninsENC == 0) && (nFaninsEC != 0)) && (nFaninsEC <= nEdgeLimit - i)) {
      Delay1 = 0;
      while ((Delay1 < nFaninsEC &&
             (iVar1 = Gia_ObjEdgeCount(pFanouts[(long)Delay1 + 2],p->vEdge1,p->vEdge2),
             iVar1 != nEdgeLimit))) {
        Delay1 = Delay1 + 1;
      }
      if (Delay1 == nFaninsEC) {
        for (Delay1 = 0; Delay1 < nFaninsEC; Delay1 = Delay1 + 1) {
          iVar1 = Gia_ObjEdgeAdd(iObj,pFanouts[(long)Delay1 + 2],p->vEdge1,p->vEdge2);
          iVar2 = Gia_ObjEdgeAdd(pFanouts[(long)Delay1 + 2],iObj,p->vEdge1,p->vEdge2);
          iNext = iVar2 + iVar1 + iNext;
        }
        if (iNext != 0) {
          printf("Wrong number of edges.\n");
        }
        if (fVerbose != 0) {
          printf("Fixed %d critical fanins\n",(ulong)(uint)nFaninsEC);
        }
        return 1;
      }
    }
    if (((nFanoutsENC == 0) && (nFanoutsEC != 0)) && (nFanoutsEC <= nEdgeLimit - i)) {
      Delay1 = 0;
      while ((Delay1 < nFanoutsEC &&
             (iVar1 = Gia_ObjEdgeCount((&nEdges)[Delay1],p->vEdge1,p->vEdge2), iVar1 != nEdgeLimit))
            ) {
        Delay1 = Delay1 + 1;
      }
      if (Delay1 == nFanoutsEC) {
        for (Delay1 = 0; Delay1 < nFanoutsEC; Delay1 = Delay1 + 1) {
          iVar1 = Gia_ObjEdgeAdd(iObj,(&nEdges)[Delay1],p->vEdge1,p->vEdge2);
          iVar2 = Gia_ObjEdgeAdd((&nEdges)[Delay1],iObj,p->vEdge1,p->vEdge2);
          iNext = iVar2 + iVar1 + iNext;
        }
        if (iNext != 0) {
          printf("Wrong number of edges.\n");
        }
        if (fVerbose != 0) {
          printf("Fixed %d critical fanouts\n",(ulong)(uint)nFanoutsEC);
        }
        return 1;
      }
    }
    if (fVerbose != 0) {
      printf("Cannot fix\n");
    }
  }
  return 0;
}

Assistant:

int Edg_ObjImprove( Gia_Man_t * p, int iObj, int nEdgeLimit, int DelayMax, int fVerbose )
{
    int nFaninsC = 0,   nFanoutsC = 0;    // critical
    int nFaninsEC = 0,  nFanoutsEC = 0;   // edge-critical
    int nFaninsENC = 0, nFanoutsENC = 0;  // edge-non-critial
    int pFanins[4], pFanouts[4];
    int nEdgeDiff, nEdges = 0, Count = 0;
    int i, iNext, Delay1, Delay2;
    // count how many fanins have critical edge
    Delay1 = Vec_IntEntry( p->vEdgeDelayR, iObj );
    //if ( Delay1 > 1 )
    Gia_LutForEachFanin2( p, iObj, iNext, i )
    {
        if ( !Gia_ObjIsAnd(Gia_ManObj(p, iNext)) )
            continue;
        Delay2 = Vec_IntEntry( p->vEdgeDelay, iNext );
        if ( Gia_ObjHaveEdge(p, iObj, iNext) )
        {
            nEdges++;
            assert( Delay1 + Delay2 <= DelayMax );
            if ( Delay1 + Delay2 == DelayMax )
                nFaninsEC++;
            else
                nFaninsENC++;
        }
        else
        {
            assert( Delay1 + Delay2 + 1 <= DelayMax );
            if ( Delay1 + Delay2 + 1 == DelayMax )
                pFanins[nFaninsC++] = iNext;
        }
    }
    // count how many fanouts have critical edge
    Delay1 = Vec_IntEntry( p->vEdgeDelay, iObj );
    //if ( Delay2 < DelayMax - 1 )
    Gia_LutForEachFanout2( p, iObj, iNext, i )
    {
        //if ( !Gia_ObjIsAnd(Gia_ManObj(p, iNext)) )
        //    continue;
        assert( Gia_ObjIsAnd(Gia_ManObj(p, iNext)) );
        Delay2 = Vec_IntEntry( p->vEdgeDelayR, iNext );
        if ( Gia_ObjHaveEdge(p, iObj, iNext) )
        {
            nEdges++;
            assert( Delay1 + Delay2 <= DelayMax );
            if ( Delay1 + Delay2 == DelayMax )
                nFanoutsEC++;
            else
                nFanoutsENC++;
        }
        else
        {
            assert( Delay1 + Delay2 + 1 <= DelayMax );
            if ( Delay1 + Delay2 + 1 == DelayMax )
            {
                if ( nFanoutsC < nEdgeLimit )
                    pFanouts[nFanoutsC] = iNext;
                nFanoutsC++;
            }
        }
    }
    if ( fVerbose )
    {
        printf( "%8d : ", iObj );
        printf( "Edges = %d  ", nEdges );
        printf( "Fanins (all %d  EC %d  ENC %d  C %d)  ", 
            Gia_ObjLutSize2(p, iObj), nFaninsEC, nFaninsENC, nFaninsC );
        printf( "Fanouts (all %d  EC %d  ENC %d  C %d)  ", 
            Gia_ObjLutFanoutNum2(p, iObj), nFanoutsEC, nFanoutsENC, nFanoutsC );
    }
    // consider simple cases
    assert( nEdges <= nEdgeLimit );
    if ( nEdges == nEdgeLimit )
    {
        if ( fVerbose )
            printf( "Full\n" );
        return 0;
    }
    nEdgeDiff = nEdgeLimit - nEdges;
    // check if fanins or fanouts could be improved
    if ( nFaninsEC == 0 && nFaninsC && nFaninsC <= nEdgeDiff )
    {
        for ( i = 0; i < nFaninsC; i++ )
            if ( Gia_ObjEdgeCount(pFanins[i], p->vEdge1, p->vEdge2) == nEdgeLimit )
                break;
        if ( i == nFaninsC )
        {
            for ( i = 0; i < nFaninsC; i++ )
            {
                Count += Gia_ObjEdgeAdd( iObj, pFanins[i], p->vEdge1, p->vEdge2 );
                Count += Gia_ObjEdgeAdd( pFanins[i], iObj, p->vEdge1, p->vEdge2 );
            }
            if ( Count )
                printf( "Wrong number of edges.\n" );
            if ( fVerbose )
                printf( "Fixed %d critical fanins\n", nFaninsC );
            return 1;
        }
    }
    if ( nFanoutsEC == 0 && nFanoutsC && nFanoutsC <= nEdgeDiff )
    {
        for ( i = 0; i < nFanoutsC; i++ )
            if ( Gia_ObjEdgeCount(pFanouts[i], p->vEdge1, p->vEdge2) == nEdgeLimit )
                break;
        if ( i == nFanoutsC )
        {
            for ( i = 0; i < nFanoutsC; i++ )
            {
                Count += Gia_ObjEdgeAdd( iObj, pFanouts[i], p->vEdge1, p->vEdge2 );
                Count += Gia_ObjEdgeAdd( pFanouts[i], iObj, p->vEdge1, p->vEdge2 );
            }
            if ( Count )
                printf( "Wrong number of edges.\n" );
            if ( fVerbose )
                printf( "Fixed %d critical fanouts\n", nFanoutsC );
            return 1;
        }
    }
    if ( fVerbose )
        printf( "Cannot fix\n" );
    return 0;
}